

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  uint uVar1;
  size_t sVar2;
  element_type *peVar3;
  ITracker *pIVar4;
  Counts *in_RSI;
  long in_RDI;
  bool local_1;
  
  sVar2 = Counts::total(in_RSI);
  if (sVar2 == 0) {
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x254d70);
    uVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[7])();
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      pIVar4 = TestCaseTracking::TrackerContext::currentTracker((TrackerContext *)(in_RDI + 0x1c8));
      uVar1 = (*pIVar4->_vptr_ITracker[5])();
      if ((uVar1 & 1) == 0) {
        *(long *)(in_RDI + 0x100) = *(long *)(in_RDI + 0x100) + 1;
        in_RSI->failed = in_RSI->failed + 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RunContext::testForMissingAssertions(Counts& assertions) {
        if (assertions.total() != 0)
            return false;
        if (!m_config->warnAboutMissingAssertions())
            return false;
        if (m_trackerContext.currentTracker().hasChildren())
            return false;
        m_totals.assertions.failed++;
        assertions.failed++;
        return true;
    }